

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O1

void hash(void *key,size_t len,uint32_t seed,size_t *r_hash)

{
  long lVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  size_t sVar7;
  uint uVar8;
  long lVar9;
  
  uVar2 = (uint)len;
  uVar8 = uVar2 + 0xf;
  if (-1 < (int)uVar2) {
    uVar8 = uVar2;
  }
  uVar6 = (ulong)seed;
  uVar4 = uVar6;
  if (0xf < (int)uVar2) {
    lVar9 = 0;
    do {
      lVar1 = *(long *)((long)key + lVar9 + 8);
      uVar4 = ((ulong)(*(long *)((long)key + lVar9) * -0x783c846eeebdac2b) >> 0x21 |
              *(long *)((long)key + lVar9) * -0x775ed61580000000) * 0x4cf5ad432745937f ^ uVar4;
      lVar5 = (uVar4 << 0x1b | uVar4 >> 0x25) + uVar6;
      uVar4 = lVar5 * 5 + 0x52dce729;
      uVar6 = ((ulong)(lVar1 * 0x4cf5ad432745937f) >> 0x1f | lVar1 * 0x4e8b26fe00000000) *
              -0x783c846eeebdac2b ^ uVar6;
      uVar6 = (lVar5 * 5 + (uVar6 << 0x1f | uVar6 >> 0x21) + 0x52dce729) * 5 + 0x38495ab5;
      lVar9 = lVar9 + 0x10;
    } while ((ulong)(uint)((int)uVar8 >> 4) << 4 != lVar9);
  }
  lVar9 = (long)((int)uVar8 >> 4) * 0x10;
  uVar3 = 0;
  switch(uVar2 & 0xf) {
  case 0xf:
    uVar3 = (ulong)*(byte *)((long)key + lVar9 + 0xe) << 0x30;
  case 0xe:
    uVar3 = uVar3 | (ulong)*(byte *)((long)key + lVar9 + 0xd) << 0x28;
  case 0xd:
    uVar3 = uVar3 ^ (ulong)*(byte *)((long)key + lVar9 + 0xc) << 0x20;
  case 0xc:
    uVar3 = uVar3 ^ (ulong)*(byte *)((long)key + lVar9 + 0xb) << 0x18;
  case 0xb:
    uVar3 = uVar3 ^ (ulong)*(byte *)((long)key + lVar9 + 10) << 0x10;
  case 10:
    uVar3 = uVar3 ^ (ulong)*(byte *)((long)key + lVar9 + 9) << 8;
  case 9:
    uVar3 = *(byte *)((long)key + lVar9 + 8) ^ uVar3;
    uVar6 = uVar6 ^ (uVar3 * 0x4cf5ad432745937f >> 0x1f | uVar3 * 0x4e8b26fe00000000) *
                    -0x783c846eeebdac2b;
  case 8:
    uVar3 = (ulong)*(byte *)((long)key + lVar9 + 7) << 0x38;
  case 7:
    uVar3 = uVar3 | (ulong)*(byte *)((long)key + lVar9 + 6) << 0x30;
  case 6:
    uVar3 = uVar3 ^ (ulong)*(byte *)((long)key + lVar9 + 5) << 0x28;
  case 5:
    uVar3 = uVar3 ^ (ulong)*(byte *)((long)key + lVar9 + 4) << 0x20;
  case 4:
    uVar3 = uVar3 ^ (ulong)*(byte *)((long)key + lVar9 + 3) << 0x18;
  case 3:
    uVar3 = uVar3 ^ (ulong)*(byte *)((long)key + lVar9 + 2) << 0x10;
  case 2:
    uVar3 = uVar3 ^ (ulong)*(byte *)((long)key + lVar9 + 1) << 8;
  case 1:
    uVar3 = *(byte *)((long)key + lVar9) ^ uVar3;
    uVar4 = uVar4 ^ (uVar3 * -0x783c846eeebdac2b >> 0x21 | uVar3 * -0x775ed61580000000) *
                    0x4cf5ad432745937f;
  case 0:
    uVar6 = uVar6 ^ (long)(int)uVar2;
    uVar4 = (uVar4 ^ (long)(int)uVar2) + uVar6;
    uVar6 = uVar6 + uVar4;
    uVar4 = (uVar4 >> 0x21 ^ uVar4) * -0xae502812aa7333;
    uVar3 = (uVar4 >> 0x21 ^ uVar4) * -0x3b314601e57a13ad;
    uVar4 = (uVar6 >> 0x21 ^ uVar6) * -0xae502812aa7333;
    uVar4 = (uVar4 >> 0x21 ^ uVar4) * -0x3b314601e57a13ad;
    uVar4 = uVar4 >> 0x21 ^ uVar4;
    sVar7 = (uVar3 >> 0x21 ^ uVar3) + uVar4;
    *r_hash = sVar7;
    r_hash[1] = uVar4 + sVar7;
    return;
  }
}

Assistant:

static inline void
hash(const void *key, size_t len, const uint32_t seed, size_t r_hash[2]) {
	assert(len <= INT_MAX); /* Unfortunate implementation limitation. */

#if (LG_SIZEOF_PTR == 3 && !defined(JEMALLOC_BIG_ENDIAN))
	hash_x64_128(key, (int)len, seed, (uint64_t *)r_hash);
#else
	{
		uint64_t hashes[2];
		hash_x86_128(key, (int)len, seed, hashes);
		r_hash[0] = (size_t)hashes[0];
		r_hash[1] = (size_t)hashes[1];
	}
#endif
}